

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O2

json __thiscall
TestServerConnector::VerifyMethodResult(TestServerConnector *this,json *id,json *result)

{
  code *pcVar1;
  bool bVar2;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  reference other;
  json_value extraout_RDX;
  double dVar3;
  double __x;
  double __x_00;
  json jVar4;
  allocator<char> local_105;
  ExpressionDecomposer local_104;
  Result local_100;
  ulong local_e0;
  string local_d8;
  ResultBuilder DOCTEST_RB;
  
  doctest::String::String((String *)&local_100,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x19,"!has_key(result, \"error\")","",(String *)&local_100);
  doctest::String::~String((String *)&local_100);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_104,DT_REQUIRE);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"error",&local_105);
  bVar2 = jsonrpccxx::has_key(result,&local_d8);
  local_e0 = (ulong)!bVar2 | (ulong)local_104.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_100,(Expression_lhs *)&local_e0);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
  doctest::String::~String(&local_100.m_decomp);
  dVar3 = (double)std::__cxx11::string::~string((string *)&local_d8);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar3);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  doctest::String::String((String *)&local_100,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1a,"result[\"jsonrpc\"] == \"2.0\"","",(String *)&local_100);
  doctest::String::~String((String *)&local_100);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_e0,DT_REQUIRE);
  local_d8._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)result,"jsonrpc");
  local_d8._M_string_length._0_4_ = local_e0._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==(&local_100,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_d8,(char (*) [4])"2.0");
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
  doctest::String::~String(&local_100.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  doctest::String::String((String *)&local_100,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1b,"result[\"id\"] == id","",(String *)&local_100);
  doctest::String::~String((String *)&local_100);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_e0,DT_REQUIRE);
  local_d8._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)result,"id");
  local_d8._M_string_length._0_4_ = local_e0._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==(&local_100,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_d8,id);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
  doctest::String::~String(&local_100.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_00);
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  doctest::String::String((String *)&local_100,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1c,"has_key(result, \"result\")","",(String *)&local_100);
  doctest::String::~String((String *)&local_100);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_104,DT_REQUIRE);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"result",&local_105);
  bVar2 = jsonrpccxx::has_key(result,&local_d8);
  local_e0 = (ulong)bVar2 | (ulong)local_104.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_100,(Expression_lhs *)&local_e0);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
  doctest::String::~String(&local_100.m_decomp);
  dVar3 = (double)std::__cxx11::string::~string((string *)&local_d8);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar3);
  if (extraout_AL_02 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar4 = (json)(*pcVar1)();
    return jVar4;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  other = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)result,"result");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this,other);
  jVar4.m_value.object = extraout_RDX.object;
  jVar4._0_8_ = this;
  return jVar4;
}

Assistant:

static json VerifyMethodResult(const json &id, json &result) {
        REQUIRE(!has_key(result, "error"));
        REQUIRE(result["jsonrpc"] == "2.0");
        REQUIRE(result["id"] == id);
        REQUIRE(has_key(result, "result"));
        return result["result"];
    }